

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O0

void dg::DOD::constructBinaryRelation
               (ColoredAp *CAp,CDNode *p,ResultT *CD,ResultT *revCD,CDNode *b2,CDNode *b3,CDNode *r1
               ,CDNode *r2)

{
  bool bVar1;
  pair<std::_Rb_tree_const_iterator<dg::CDNode_*>,_bool> pVar2;
  CDNode *gcur_1;
  CDNode *gcur;
  CDNode *cur;
  CDNode *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  _Rb_tree_const_iterator<dg::CDNode_*> in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  undefined1 in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffa9;
  _Rb_tree_const_iterator<dg::CDNode_*> in_stack_ffffffffffffffb0;
  
  do {
    ColoredAp::getGNode((ColoredAp *)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
                        (CDNode *)in_stack_ffffffffffffff88._M_node);
    std::
    map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
    ::operator[]((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                  *)in_stack_ffffffffffffffb0._M_node,
                 (key_type *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8));
    pVar2 = std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::insert
                      ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *)
                       CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
                       (value_type *)in_stack_ffffffffffffff88._M_node);
    in_stack_ffffffffffffffb0 = pVar2.first._M_node;
    std::
    map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
    ::operator[]((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                  *)in_stack_ffffffffffffffb0._M_node,
                 (key_type *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8));
    pVar2 = std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::insert
                      ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *)
                       CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
                       (value_type *)in_stack_ffffffffffffff88._M_node);
    in_stack_ffffffffffffffa8 = pVar2.second;
    ElemWithEdges<dg::CDNode>::getSingleSuccessor
              ((ElemWithEdges<dg::CDNode> *)
               CONCAT17(in_stack_ffffffffffffff77,
                        CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)));
    bVar1 = ColoredAp::isBlue((ColoredAp *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)
                                      ),in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff77 = true;
    if (!bVar1) {
      in_stack_ffffffffffffff77 =
           ColoredAp::isRed((ColoredAp *)
                            CONCAT17(1,CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)
                                    ),in_stack_ffffffffffffff68);
    }
  } while (((in_stack_ffffffffffffff77 ^ 0xff) & 1) != 0);
  do {
    ColoredAp::getGNode((ColoredAp *)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
                        (CDNode *)in_stack_ffffffffffffff88._M_node);
    std::
    map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
    ::operator[]((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                  *)in_stack_ffffffffffffffb0._M_node,
                 (key_type *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8));
    pVar2 = std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::insert
                      ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *)
                       CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
                       (value_type *)in_stack_ffffffffffffff88._M_node);
    in_stack_ffffffffffffff88 = pVar2.first._M_node;
    in_stack_ffffffffffffff90 = pVar2.second;
    std::
    map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
    ::operator[]((map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                  *)in_stack_ffffffffffffffb0._M_node,
                 (key_type *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8));
    std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::insert
              ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *)
               CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
               (value_type *)in_stack_ffffffffffffff88._M_node);
    ElemWithEdges<dg::CDNode>::getSingleSuccessor
              ((ElemWithEdges<dg::CDNode> *)
               CONCAT17(in_stack_ffffffffffffff77,
                        CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)));
    bVar1 = ColoredAp::isBlue((ColoredAp *)
                              CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)
                                      ),in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff76 = true;
    if (!bVar1) {
      in_stack_ffffffffffffff76 =
           ColoredAp::isRed((ColoredAp *)
                            CONCAT17(in_stack_ffffffffffffff77,CONCAT16(1,in_stack_ffffffffffffff70)
                                    ),in_stack_ffffffffffffff68);
    }
  } while (((in_stack_ffffffffffffff76 ^ 0xff) & 1) != 0);
  return;
}

Assistant:

static void constructBinaryRelation(ColoredAp &CAp, CDNode *p, ResultT &CD,
                                        ResultT &revCD, CDNode *b2, CDNode *b3,
                                        CDNode *r1, CDNode *r2) {
        auto *cur = b2;
        do {
            auto *gcur = CAp.getGNode(cur);
            assert(gcur);
            CD[gcur].insert(p);
            revCD[p].insert(gcur);
            // DBG(cda, p->getID() << " - dod -> " << gcur->getID());
            cur = cur->getSingleSuccessor();
        } while (!(CAp.isBlue(cur) || CAp.isRed(cur)));
        assert(cur == r1);
        (void) r1;

        cur = r2;
        do {
            auto *gcur = CAp.getGNode(cur);
            assert(gcur);
            CD[gcur].insert(p);
            revCD[p].insert(gcur);
            // DBG(cda, p->getID() << " - dod -> " << gcur->getID());
            cur = cur->getSingleSuccessor();
        } while (!(CAp.isBlue(cur) || CAp.isRed(cur)));
        assert(cur == b3);
        (void) b3;
    }